

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O3

bool wasm::StackSignature::haveLeastUpperBound(StackSignature a,StackSignature b)

{
  uintptr_t uVar1;
  StackSignature self;
  StackSignature self_00;
  StackSignature other;
  StackSignature other_00;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Type *pTVar7;
  Type TVar8;
  ulong uVar9;
  size_t sVar10;
  void *in_RDI;
  uintptr_t in_stack_00000008;
  Iterator local_50;
  Type local_40;
  Type local_38;
  
  self.results.id = a.params.id;
  self.params.id = in_stack_00000008;
  self._16_8_ = a.results.id;
  other.results.id = b.params.id;
  other.params.id = a._16_8_;
  other._16_8_ = b.results.id;
  bVar3 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                    (in_RDI,self,other);
  if ((bVar3) &&
     (self_00.results.id = b.params.id, self_00.params.id = a._16_8_, self_00._16_8_ = b.results.id,
     other_00.results.id = a.params.id, other_00.params.id = in_stack_00000008,
     other_00._16_8_ = a.results.id,
     bVar3 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                       (in_RDI,self_00,other_00), bVar3)) {
    local_40.id = in_stack_00000008;
    local_38.id = a._16_8_;
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = wasm::Type::size(&local_40);
    TVar8.id = local_40.id;
    if (sVar4 < sVar5) {
      local_40.id = local_38.id;
      local_38.id = TVar8.id;
    }
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = wasm::Type::size(&local_40);
    sVar6 = wasm::Type::size(&local_40);
    if (sVar6 != 0) {
      sVar10 = 0;
      do {
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_40;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar10;
        pTVar7 = wasm::Type::Iterator::operator*(&local_50);
        uVar1 = pTVar7->id;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (sVar4 - sVar5) + sVar10;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_38;
        pTVar7 = wasm::Type::Iterator::operator*(&local_50);
        if (uVar1 != pTVar7->id) {
          __assert_fail("a == b && \"TODO: calculate greatest lower bound to handle \" \"contravariance correctly\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/stack-utils.cpp"
                        ,0xd6,
                        "auto wasm::StackSignature::haveLeastUpperBound(StackSignature, StackSignature)::(anonymous class)::operator()(Type, Type) const"
                       );
        }
        sVar10 = sVar10 + 1;
      } while (sVar6 != sVar10);
    }
    local_40.id = a.params.id;
    local_38.id = b.params.id;
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = wasm::Type::size(&local_40);
    TVar8.id = local_40.id;
    if (sVar4 < sVar5) {
      local_40.id = local_38.id;
      local_38.id = TVar8.id;
    }
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = wasm::Type::size(&local_40);
    sVar6 = wasm::Type::size(&local_40);
    if (sVar6 == 0) {
      return true;
    }
    local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_40;
    pTVar7 = wasm::Type::Iterator::operator*(&local_50);
    TVar8.id = pTVar7->id;
    local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_38;
    local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         sVar4 - sVar5;
    pTVar7 = wasm::Type::Iterator::operator*(&local_50);
    TVar8 = wasm::Type::getLeastUpperBound(TVar8,pTVar7->id);
    if (TVar8.id != 0) {
      uVar2 = 1;
      do {
        uVar9 = uVar2;
        if (sVar6 == uVar9) break;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_40;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar9;
        pTVar7 = wasm::Type::Iterator::operator*(&local_50);
        TVar8.id = pTVar7->id;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (sVar4 - sVar5) + uVar9;
        local_50.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_38;
        pTVar7 = wasm::Type::Iterator::operator*(&local_50);
        TVar8 = wasm::Type::getLeastUpperBound(TVar8,pTVar7->id);
        uVar2 = uVar9 + 1;
      } while (TVar8.id != 0);
      return sVar6 <= uVar9;
    }
  }
  return false;
}

Assistant:

bool StackSignature::haveLeastUpperBound(StackSignature a, StackSignature b) {
  // If a signature is polymorphic, the LUB could extend its params and results
  // arbitrarily. Otherwise, the LUB must extend its params and results
  // uniformly so that each additional param is a subtype of the corresponding
  // additional result.
  auto extensionCompatible = [](auto self, auto other) -> bool {
    if (self.kind == Polymorphic) {
      return true;
    }
    // If no extension, then no problem.
    if (self.params.size() >= other.params.size() &&
        self.results.size() >= other.results.size()) {
      return true;
    }
    auto extSize = other.params.size() - self.params.size();
    if (extSize != other.results.size() - self.results.size()) {
      return false;
    }
    return std::equal(other.params.begin(),
                      other.params.begin() + extSize,
                      other.results.begin(),
                      other.results.begin() + extSize,
                      [](const Type& param, const Type& result) {
                        return Type::isSubType(param, result);
                      });
  };
  if (!extensionCompatible(a, b) || !extensionCompatible(b, a)) {
    return false;
  }

  auto valsCompatible = [](auto as, auto bs, auto compatible) -> bool {
    // Canonicalize so the as are shorter and any unshared prefix is on bs.
    if (bs.size() < as.size()) {
      std::swap(as, bs);
    }
    // Check that shared values after the unshared prefix have are compatible.
    size_t diff = bs.size() - as.size();
    for (size_t i = 0, shared = as.size(); i < shared; ++i) {
      if (!compatible(as[i], bs[i + diff])) {
        return false;
      }
    }
    return true;
  };

  bool paramsOk = valsCompatible(a.params, b.params, [](Type a, Type b) {
    assert(a == b && "TODO: calculate greatest lower bound to handle "
                     "contravariance correctly");
    return true;
  });
  bool resultsOk = valsCompatible(a.results, b.results, [](Type a, Type b) {
    return Type::getLeastUpperBound(a, b) != Type::none;
  });
  return paramsOk && resultsOk;
}